

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findkey.c
# Opt level: O3

LispPTR N_OP_findkey(LispPTR tos,int byte)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  uint uVar3;
  
  if ((MachineState.pvar[-10] & 1) == 0) {
    pLVar1 = (LispPTR *)(MachineState.pvar + -0x10);
  }
  else {
    pLVar1 = (LispPTR *)((ulong)((uint)(ushort)(MachineState.pvar[-1] - 4) * 2) + (long)Stackspace);
  }
  pLVar2 = (LispPTR *)(MachineState.ivar + (long)(byte * 2) + -2);
  if (pLVar2 <= pLVar1) {
    uVar3 = byte + 1;
    do {
      if (*pLVar2 == tos) {
        return uVar3 & 0xffff | 0xe0000;
      }
      pLVar2 = pLVar2 + 2;
      uVar3 = uVar3 + 2;
    } while (pLVar2 <= pLVar1);
  }
  return 0;
}

Assistant:

LispPTR N_OP_findkey(LispPTR tos, int byte) {
  LispPTR *ptr;
  DLword *find_end;
  DLword arg_nth;

#ifdef TRACE
  printPC();
  printf("TRACE : N_OP_findkey \n");
#endif

  if (CURRENTFX->alink & 1) { /* slow case */
    find_end = NativeAligned2FromStackOffset(CURRENTFX->blink - 4);
  } else { /*  Fast cae */
    find_end = ((DLword *)CURRENTFX) - 2 - 4;
  }

  arg_nth = byte + 1;

  for (ptr = (LispPTR *)(IVar + ((byte * 2) - 2)); (UNSIGNED)find_end >= (UNSIGNED)ptr;
       ptr += 2, arg_nth += 2) {
    if (*ptr == tos) { /* KEY founded */
      return (S_POSITIVE | arg_nth);
    }
  } /* for end */

  /* No matched */

  return (NIL_PTR);

}